

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O3

void MRIStepCoupling_Write(MRIStepCoupling MRIC,FILE *outfile)

{
  sunrealtype **ppsVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  if (MRIC != (MRIStepCoupling)0x0) {
    if (MRIC->W == (sunrealtype ***)0x0) {
      if (MRIC->G == (sunrealtype ***)0x0) {
        return;
      }
      if (MRIC->c == (sunrealtype *)0x0) {
        return;
      }
      uVar3 = (ulong)(uint)MRIC->nmat;
    }
    else {
      if (MRIC->c == (sunrealtype *)0x0) {
        return;
      }
      uVar3 = (ulong)MRIC->nmat;
      if (0 < (long)uVar3) {
        uVar2 = 0;
        do {
          ppsVar1 = MRIC->W[uVar2];
          if (ppsVar1 == (sunrealtype **)0x0) {
            return;
          }
          if (0 < (long)MRIC->stages) {
            lVar4 = 0;
            do {
              if (ppsVar1[lVar4] == (sunrealtype *)0x0) {
                return;
              }
              lVar4 = lVar4 + 1;
            } while (MRIC->stages != lVar4);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != uVar3);
      }
    }
    if (0 < (int)uVar3 && MRIC->G != (sunrealtype ***)0x0) {
      uVar2 = 0;
      do {
        ppsVar1 = MRIC->G[uVar2];
        if (ppsVar1 == (sunrealtype **)0x0) {
          return;
        }
        if (0 < (long)MRIC->stages) {
          lVar4 = 0;
          do {
            if (ppsVar1[lVar4] == (sunrealtype *)0x0) {
              return;
            }
            lVar4 = lVar4 + 1;
          } while (MRIC->stages != lVar4);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != (uVar3 & 0xffffffff));
    }
    fprintf((FILE *)outfile,"  nmat = %i\n");
    fprintf((FILE *)outfile,"  stages = %i\n",(ulong)(uint)MRIC->stages);
    fprintf((FILE *)outfile,"  method order (q) = %i\n",(ulong)(uint)MRIC->q);
    fprintf((FILE *)outfile,"  embedding order (p) = %i\n",(ulong)(uint)MRIC->p);
    fwrite("  c = ",6,1,(FILE *)outfile);
    if (0 < MRIC->stages) {
      lVar4 = 0;
      do {
        fprintf((FILE *)outfile,"%.16g  ",MRIC->c[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < MRIC->stages);
    }
    fputc(10,(FILE *)outfile);
    if ((MRIC->W != (sunrealtype ***)0x0) && (0 < MRIC->nmat)) {
      uVar3 = 0;
      do {
        fprintf((FILE *)outfile,"  W[%i] = \n",uVar3 & 0xffffffff);
        if (0 < MRIC->stages) {
          lVar4 = 0;
          do {
            fwrite("      ",6,1,(FILE *)outfile);
            if (0 < MRIC->stages) {
              lVar5 = 0;
              do {
                fprintf((FILE *)outfile,"%23.16g  ",MRIC->W[uVar3][lVar4][lVar5]);
                lVar5 = lVar5 + 1;
              } while (lVar5 < MRIC->stages);
            }
            fputc(10,(FILE *)outfile);
            lVar4 = lVar4 + 1;
          } while (lVar4 < MRIC->stages);
        }
        fputc(10,(FILE *)outfile);
        uVar3 = uVar3 + 1;
      } while ((long)uVar3 < (long)MRIC->nmat);
    }
    if ((MRIC->G != (sunrealtype ***)0x0) && (0 < MRIC->nmat)) {
      uVar3 = 0;
      do {
        fprintf((FILE *)outfile,"  G[%i] = \n",uVar3 & 0xffffffff);
        if (0 < MRIC->stages) {
          lVar4 = 0;
          do {
            fwrite("      ",6,1,(FILE *)outfile);
            if (0 < MRIC->stages) {
              lVar5 = 0;
              do {
                fprintf((FILE *)outfile,"%23.16g  ",MRIC->G[uVar3][lVar4][lVar5]);
                lVar5 = lVar5 + 1;
              } while (lVar5 < MRIC->stages);
            }
            fputc(10,(FILE *)outfile);
            lVar4 = lVar4 + 1;
          } while (lVar4 < MRIC->stages);
        }
        fputc(10,(FILE *)outfile);
        uVar3 = uVar3 + 1;
      } while ((long)uVar3 < (long)MRIC->nmat);
    }
  }
  return;
}

Assistant:

void MRIStepCoupling_Write(MRIStepCoupling MRIC, FILE* outfile)
{
  int i, j, k;

  /* check for vaild coupling structure */
  if (!MRIC) { return; }
  if (!(MRIC->W) && !(MRIC->G)) { return; }
  if (!(MRIC->c)) { return; }

  if (MRIC->W)
  {
    for (i = 0; i < MRIC->nmat; i++)
    {
      if (!(MRIC->W[i])) { return; }
      for (j = 0; j < MRIC->stages; j++)
      {
        if (!(MRIC->W[i][j])) { return; }
      }
    }
  }

  if (MRIC->G)
  {
    for (i = 0; i < MRIC->nmat; i++)
    {
      if (!(MRIC->G[i])) { return; }
      for (j = 0; j < MRIC->stages; j++)
      {
        if (!(MRIC->G[i][j])) { return; }
      }
    }
  }

  fprintf(outfile, "  nmat = %i\n", MRIC->nmat);
  fprintf(outfile, "  stages = %i\n", MRIC->stages);
  fprintf(outfile, "  method order (q) = %i\n", MRIC->q);
  fprintf(outfile, "  embedding order (p) = %i\n", MRIC->p);
  fprintf(outfile, "  c = ");
  for (i = 0; i < MRIC->stages; i++)
  {
    fprintf(outfile, "%" RSYM "  ", MRIC->c[i]);
  }
  fprintf(outfile, "\n");

  if (MRIC->W)
  {
    for (k = 0; k < MRIC->nmat; k++)
    {
      fprintf(outfile, "  W[%i] = \n", k);
      for (i = 0; i < MRIC->stages; i++)
      {
        fprintf(outfile, "      ");
        for (j = 0; j < MRIC->stages; j++)
        {
          fprintf(outfile, "%" RSYMW "  ", MRIC->W[k][i][j]);
        }
        fprintf(outfile, "\n");
      }
      fprintf(outfile, "\n");
    }
  }

  if (MRIC->G)
  {
    for (k = 0; k < MRIC->nmat; k++)
    {
      fprintf(outfile, "  G[%i] = \n", k);
      for (i = 0; i < MRIC->stages; i++)
      {
        fprintf(outfile, "      ");
        for (j = 0; j < MRIC->stages; j++)
        {
          fprintf(outfile, "%" RSYMW "  ", MRIC->G[k][i][j]);
        }
        fprintf(outfile, "\n");
      }
      fprintf(outfile, "\n");
    }
  }
}